

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O3

double matd_vec_dist(matd_t *a,matd_t *b)

{
  int n;
  double dVar1;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x358,"double matd_vec_dist(const matd_t *, const matd_t *)");
  }
  if (b != (matd_t *)0x0) {
    if ((a->ncols == 1) || (a->nrows == 1)) {
      if (b->nrows == 1 || b->ncols == 1) {
        n = a->ncols * a->nrows;
        if (n == b->nrows * b->ncols) {
          dVar1 = matd_vec_dist_n(a,b,n);
          return dVar1;
        }
        __assert_fail("a->nrows*a->ncols == b->nrows*b->ncols",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                      ,0x35b,"double matd_vec_dist(const matd_t *, const matd_t *)");
      }
    }
    __assert_fail("matd_is_vector(a) && matd_is_vector(b)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x35a,"double matd_vec_dist(const matd_t *, const matd_t *)");
  }
  __assert_fail("b != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0x359,"double matd_vec_dist(const matd_t *, const matd_t *)");
}

Assistant:

double matd_vec_dist(const matd_t *a, const matd_t *b)
{
    assert(a != NULL);
    assert(b != NULL);
    assert(matd_is_vector(a) && matd_is_vector(b));
    assert(a->nrows*a->ncols == b->nrows*b->ncols);

    int lena = a->nrows*a->ncols;
    return matd_vec_dist_n(a, b, lena);
}